

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::KillChildren> * __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::operator&
          (AVisitor<hiberlite::KillChildren> *this,
          collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *nvp)

{
  KillChildren *this_00;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_60;
  
  this_00 = this->actor;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::collection_nvp(&local_60,nvp);
  KillChildren::
  act<hiberlite::AVisitor<hiberlite::KillChildren>,std::vector<int,std::allocator<int>>,hiberlite::stl_stream_adapter<std::vector<int,std::allocator<int>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
            (this_00,this,&local_60);
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~collection_nvp(&local_60);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}